

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O0

void __thiscall ktx::CommandHelp::executeHelp(CommandHelp *this)

{
  bool bVar1;
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_t sVar3;
  char *pcVar4;
  long in_RDI;
  int result_1;
  string systemCommand_1;
  int result;
  string systemCommand;
  string manFile;
  path executableDir;
  path executablePath;
  path *in_stack_fffffffffffffb10;
  path *in_stack_fffffffffffffb18;
  size_t *psVar5;
  path *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  path *in_stack_fffffffffffffb38;
  char (*in_stack_fffffffffffffb40) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb60;
  format fVar6;
  char (*in_stack_fffffffffffffb68) [15];
  path *in_stack_fffffffffffffb70;
  string local_470 [32];
  char *local_450;
  char *local_448;
  size_t local_440;
  string local_438 [36];
  int local_414;
  char *local_410;
  size_t local_408;
  string local_400 [72];
  string local_3b8 [32];
  char *local_398;
  string local_390 [32];
  char *local_370;
  size_t local_368;
  string local_360 [168];
  path local_2b8;
  format_args in_stack_fffffffffffffd78;
  string_view in_stack_fffffffffffffd88;
  undefined8 local_258;
  undefined1 *local_250;
  char *local_248;
  string *local_238;
  char **local_230;
  string *local_228;
  char *local_220;
  size_t sStack_218;
  string *local_210;
  char *local_208;
  char **local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f8 [2];
  undefined8 local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1e0;
  char *local_1d8;
  string *local_1c8;
  char *local_1c0;
  size_t sStack_1b8;
  string *local_1b0;
  char *local_1a8;
  char **local_1a0;
  undefined1 local_198 [32];
  undefined8 local_178;
  undefined1 *local_170;
  char *local_168;
  string *local_158;
  char **local_150;
  char *local_148;
  size_t sStack_140;
  string *local_138;
  char *local_130;
  char **local_128;
  char *local_120;
  char **local_118;
  char *local_110;
  char **local_108;
  char *local_100;
  char **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f0;
  undefined8 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c8;
  char **local_c0;
  char *local_b8;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  char *local_78;
  char **local_70;
  char *local_68;
  char *local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (format)((ulong)in_stack_fffffffffffffb60 >> 0x38));
  std::filesystem::canonical(&local_2b8);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
  std::filesystem::__cxx11::path::path(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  this_00 = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
  local_200 = &local_370;
  local_208 = "{}/../share/man/man1/ktx{}{}.1";
  local_100 = "{}/../share/man/man1/ktx{}{}.1";
  local_370 = "{}/../share/man/man1/ktx{}{}.1";
  psVar5 = &local_368;
  local_f8 = local_200;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::char_traits<char>::length((char_type *)0x29b61f);
  *psVar5 = (size_t)pbVar2;
  fVar6 = (format)((ulong)psVar5 >> 0x38);
  local_78 = local_208;
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffb38);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x29b66d);
  local_398 = "";
  if (bVar1) {
    local_398 = "_";
  }
  std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  local_210 = local_360;
  local_220 = local_370;
  sStack_218 = local_368;
  local_228 = local_390;
  local_230 = &local_398;
  local_238 = local_3b8;
  local_c0 = &local_220;
  local_248 = local_370;
  local_b8 = local_248;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,char_const*,std::__cxx11::string>
            (in_stack_fffffffffffffb48,(char **)in_stack_fffffffffffffb40,
             &in_stack_fffffffffffffb38->_M_pathname);
  local_a0 = &local_258;
  local_a8 = &stack0xfffffffffffffd78;
  local_90 = 0xdcd;
  local_258 = 0xdcd;
  local_98 = local_a8;
  local_88 = local_a0;
  local_80 = local_a8;
  local_250 = local_a8;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_390);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (this_00,pbVar2,fVar6);
  bVar1 = std::filesystem::exists(in_stack_fffffffffffffb10);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
  if (bVar1) {
    local_1a0 = &local_410;
    local_1a8 = "man \"{}\"";
    local_110 = "man \"{}\"";
    local_410 = "man \"{}\"";
    psVar5 = &local_408;
    local_108 = local_1a0;
    sVar3 = std::char_traits<char>::length((char_type *)0x29b8e1);
    *psVar5 = sVar3;
    local_58 = local_1a8;
    local_1b0 = local_400;
    local_1c0 = local_410;
    sStack_1b8 = local_408;
    local_1c8 = local_360;
    local_70 = &local_1c0;
    local_1d8 = local_410;
    local_68 = local_1d8;
    local_1f8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             (&in_stack_fffffffffffffb18->_M_pathname);
    local_e8 = &local_1e8;
    local_f0 = local_1f8;
    local_d8 = 0xd;
    local_1e8 = 0xd;
    local_e0 = local_f0;
    local_d0 = local_e8;
    local_c8 = local_f0;
    local_1e0 = local_f0;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd78);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_414 = system(pcVar4);
    std::__cxx11::string::~string(local_400);
  }
  else {
    local_128 = &local_448;
    local_130 = "man ktx{}{}";
    local_120 = "man ktx{}{}";
    local_448 = "man ktx{}{}";
    psVar5 = &local_440;
    local_118 = local_128;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::char_traits<char>::length((char_type *)0x29bc33);
    *psVar5 = (size_t)pbVar2;
    local_8 = local_130;
    in_stack_fffffffffffffb10 = (path *)(in_RDI + 0x48);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x29bc6a);
    local_450 = "";
    if (bVar1) {
      local_450 = "_";
    }
    std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    local_138 = local_438;
    local_148 = local_448;
    sStack_140 = local_440;
    local_150 = &local_450;
    local_158 = local_470;
    local_50 = &local_148;
    local_168 = local_448;
    local_48 = local_168;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,std::__cxx11::string>
              ((char **)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),pbVar2);
    local_30 = &local_178;
    local_38 = local_198;
    local_18 = 0xdc;
    local_178 = 0xdc;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_170 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_470);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    system(pcVar4);
    std::__cxx11::string::~string(local_438);
  }
  std::__cxx11::string::~string(local_360);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb10);
  return;
}

Assistant:

void CommandHelp::executeHelp() {
    // On windows open the html pages with the browser
    // On linux/macos open the man pages with man

#if defined(_WIN32)
    DWORD size = 256;
    std::wstring executablePath;
    do {
        size *= 2;
        executablePath.resize(size);
    } while (GetModuleFileNameW(nullptr, executablePath.data(), size) == size);

    PathCchRemoveFileSpec(executablePath.data(), executablePath.size());
    executablePath.resize(wcslen(executablePath.c_str()));

    const auto commandStr = options.command.value_or("");
    const auto systemCommand = fmt::format(L"{}\\..\\share\\doc\\KTX-Software\\html\\ktxtools\\ktx{}{}.html",
            executablePath,
            options.command ? L"_" : L"",
            std::wstring(commandStr.begin(), commandStr.end()));

    auto result = ShellExecuteW(nullptr, nullptr, systemCommand.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    auto r = reinterpret_cast<INT_PTR>(result);
    if (r <= 32) // WinAPI is weird
        fatal(rc::RUNTIME_ERROR, "Failed to open the html documentation: ERROR {}", r);

#else
#   if defined(__APPLE__)
    char buf[PATH_MAX];
    uint32_t bufsize = PATH_MAX;
    if (const auto ec = _NSGetExecutablePath(buf, &bufsize))
        fatal(rc::RUNTIME_ERROR, "Failed to determine executable path: ERROR {}", ec);
    const auto executablePath = std::filesystem::canonical(buf);
#   else // Linux
    const auto executablePath = std::filesystem::canonical("/proc/self/exe");
#   endif

    const auto executableDir = std::filesystem::path(executablePath).remove_filename();
    const auto manFile = fmt::format("{}/../share/man/man1/ktx{}{}.1",
                executableDir.string(),
                options.command ? "_" : "",
                options.command.value_or(""));
    if (std::filesystem::exists(manFile)) {
        // We have relative access to the man file, prioritize opening it
        // that way to support custom install locations
        const auto systemCommand = fmt::format("man \"{}\"", manFile);
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    } else {
        const auto systemCommand = fmt::format("man ktx{}{}",
                options.command ? "_" : "",
                options.command.value_or(""));
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    }
#endif
}